

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode expand(UA_NodeStore *ns)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  UA_NodeStoreEntry **__ptr;
  UA_NodeStoreEntry *pUVar4;
  uint uVar5;
  UA_StatusCode UVar6;
  UA_NodeStoreEntry **ppUVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar2 = ns->size;
  uVar3 = ns->count;
  uVar8 = uVar3 * 2;
  if (uVar8 < uVar2) {
    if (uVar2 < 0x41) {
      return 0;
    }
    if (uVar2 < uVar3 * 8) {
      return 0;
    }
  }
  __ptr = ns->entries;
  uVar5 = 0x1e;
  uVar12 = 0;
  do {
    uVar11 = uVar12 & 0xffff;
    iVar10 = (uVar5 & 0xffff) - uVar11;
    uVar12 = (uint)(iVar10 - (iVar10 >> 0x1f)) >> 1;
    uVar1 = uVar11 + uVar12;
    uVar5 = uVar5 & 0xffff;
    if (uVar8 <= primes[(ushort)uVar1]) {
      uVar5 = uVar1;
    }
    uVar12 = uVar11 + 1 + uVar12;
    if (uVar8 <= primes[(ushort)uVar1]) {
      uVar12 = uVar11;
    }
  } while ((short)uVar12 != (short)uVar5);
  uVar8 = primes[uVar5 & 0xffff];
  ppUVar7 = (UA_NodeStoreEntry **)calloc((ulong)uVar8,8);
  if (ppUVar7 == (UA_NodeStoreEntry **)0x0) {
    UVar6 = 0x80030000;
  }
  else {
    ns->entries = ppUVar7;
    ns->size = uVar8;
    ns->sizePrimeIndex = uVar5 & 0xffff;
    if ((ulong)uVar3 != 0 && (ulong)uVar2 != 0) {
      uVar13 = 1;
      uVar9 = 0;
      do {
        pUVar4 = __ptr[uVar13 - 1];
        if ((UA_NodeStoreEntry *)0x1 < pUVar4) {
          ppUVar7 = findSlot(ns,&(pUVar4->node).nodeId);
          if (ppUVar7 == (UA_NodeStoreEntry **)0x0) {
            __assert_fail("e",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x4b28,"UA_StatusCode expand(UA_NodeStore *)");
          }
          *ppUVar7 = pUVar4;
          uVar9 = uVar9 + 1;
        }
      } while ((uVar13 < uVar2) && (uVar13 = uVar13 + 1, uVar9 < uVar3));
    }
    free(__ptr);
    UVar6 = 0;
  }
  return UVar6;
}

Assistant:

static UA_StatusCode
expand(UA_NodeStore *ns) {
    UA_UInt32 osize = ns->size;
    UA_UInt32 count = ns->count;
    /* Resize only when table after removal of unused elements is either too
       full or too empty */
    if(count * 2 < osize && (count * 8 > osize || osize <= UA_NODESTORE_MINSIZE))
        return UA_STATUSCODE_GOOD;

    UA_NodeStoreEntry **oentries = ns->entries;
    UA_UInt32 nindex = higher_prime_index(count * 2);
    UA_UInt32 nsize = primes[nindex];
    UA_NodeStoreEntry **nentries = UA_calloc(nsize, sizeof(UA_NodeStoreEntry*));
    if(!nentries)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    ns->entries = nentries;
    ns->size = nsize;
    ns->sizePrimeIndex = nindex;

    /* recompute the position of every entry and insert the pointer */
    for(size_t i = 0, j = 0; i < osize && j < count; ++i) {
        if(oentries[i] <= UA_NODESTORE_TOMBSTONE)
            continue;
        UA_NodeStoreEntry **e = findSlot(ns, &oentries[i]->node.nodeId);
        UA_assert(e);
        *e = oentries[i];
        ++j;
    }

    UA_free(oentries);
    return UA_STATUSCODE_GOOD;
}